

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool __thiscall ON_PolyCurve::SetEndPoint(ON_PolyCurve *this,ON_3dPoint end_point)

{
  undefined1 uVar1;
  long lVar3;
  ON_Curve *pOVar4;
  int iVar2;
  
  lVar3 = (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if (lVar3 < 1) {
    pOVar4 = (ON_Curve *)0x0;
  }
  else {
    pOVar4 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar3 + -1];
  }
  if (pOVar4 == (ON_Curve *)0x0) {
    uVar1 = 0;
  }
  else {
    iVar2 = (*(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3a])();
    uVar1 = (undefined1)iVar2;
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return (bool)uVar1;
}

Assistant:

bool ON_PolyCurve::SetEndPoint(ON_3dPoint end_point)
{
  bool rc = false;
  // just do it // if ( !IsClosed() )
  {
    ON_Curve* c = LastSegmentCurve();
    if ( c )
      rc = c->SetEndPoint(end_point);
  }
	DestroyCurveTree();
  return rc;
}